

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

void __thiscall cilkred_map::rehash(cilkred_map *this,__cilkrts_worker *w)

{
  size_t sVar1;
  size_t nbuckets;
  bucket **buckets;
  bucket *pbVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  elem *peVar6;
  
  if ((w == (__cilkrts_worker *)0x0 && this->g == (global_state_t *)0x0) || (w->g == this->g)) {
    sVar1 = this->nelem;
    nbuckets = this->nbuckets;
    buckets = this->buckets;
    make_buckets(this,w,nbuckets * 2);
    for (sVar5 = 0; sVar5 != nbuckets; sVar5 = sVar5 + 1) {
      pbVar2 = buckets[sVar5];
      if (pbVar2 != (bucket *)0x0) {
        for (peVar6 = pbVar2->el; peVar6->key != (void *)0x0; peVar6 = peVar6 + 1) {
          insert_no_rehash(this,w,peVar6->key,peVar6->hb,peVar6->view);
        }
      }
    }
    if (this->nelem == sVar1) {
      free_buckets(w,buckets,nbuckets);
      return;
    }
    pcVar3 = "nelem == onelem";
    uVar4 = 0x1ea;
  }
  else {
    pcVar3 = "(w == 0 && g == 0) || w->g == g";
    uVar4 = 0x1d7;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                ,uVar4,pcVar3);
}

Assistant:

void cilkred_map::rehash(__cilkrts_worker *w)
{
#if REDPAR_DEBUG >= 1
    fprintf(stderr, "[W=%d, desc=rehash, this_map=%p, g=%p, w->g=%p]\n",
	    w->self, this, g, w->g);
    verify_current_wkr(w);
#endif
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    
    size_t onbuckets = nbuckets;
    size_t onelem = nelem;
    bucket **obuckets = buckets;
    size_t i;
    bucket *b;

    make_buckets(w, nextsz(nbuckets));
     
    for (i = 0; i < onbuckets; ++i) {
        b = obuckets[i];
        if (b) {
            elem *oel;
            for (oel = b->el; oel->key; ++oel)
                insert_no_rehash(w, oel->key, oel->hb, oel->view);
        }
    }

    CILK_ASSERT(nelem == onelem);

    free_buckets(w, obuckets, onbuckets);
}